

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::MessageParseError::MessageParseError(MessageParseError *this,MessageParseError *param_1)

{
  MessageParseError *param_1_local;
  MessageParseError *this_local;
  
  Exception::Exception(&this->super_Exception,&param_1->super_Exception);
  *(undefined ***)&this->super_Exception = &PTR__MessageParseError_00330060;
  return;
}

Assistant:

MessageParseError(const std::string &what = "")
      : Exception("Could not parse message", what) {}